

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_long,_long>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_long,_long> *this)

{
  ulong uVar1;
  unsigned_long *puVar2;
  long lVar3;
  bool bVar4;
  unsigned_long uVar5;
  ulong uVar6;
  unsigned_long value;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  
  bVar7 = true;
  if (this->compression_buffer_idx != 0) {
    if (((this->all_invalid == false) && (this->maximum != this->minimum)) ||
       (1 < (byte)(this->mode - AUTO))) {
      bVar4 = TrySubtractOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                        (this->maximum,this->minimum,&this->min_max_diff);
      this->can_do_for = bVar4;
      CalculateDeltaStats(this);
      if (this->can_do_delta == true) {
        lVar10 = this->minimum_delta;
        if ((this->maximum_delta == lVar10) && ((this->mode & ~AUTO) != DELTA_FOR)) {
          this->total_size = this->total_size + 0x14;
          return true;
        }
        uVar1 = this->min_max_diff;
        uVar6 = this->min_max_delta_diff;
        lVar3 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        bVar9 = 0x40 - ((byte)lVar3 ^ 0x3f);
        if (uVar6 >> 0x38 != 0) {
          bVar9 = 0x40;
        }
        bVar8 = 0;
        if (uVar6 != 0) {
          bVar8 = bVar9;
        }
        lVar3 = 0x3f;
        if (uVar1 != 0) {
          for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        bVar9 = 0x40 - ((byte)lVar3 ^ 0x3f);
        if (uVar1 >> 0x38 != 0) {
          bVar9 = 0x40;
        }
        bVar4 = this->mode != FOR;
        if ((bVar4 && uVar1 != 0) && bVar8 < bVar9) {
          if (this->compression_buffer_idx != 0) {
            uVar6 = 0;
            do {
              this->delta_buffer[uVar6] = this->delta_buffer[uVar6] - lVar10;
              uVar6 = uVar6 + 1;
            } while (uVar6 < this->compression_buffer_idx);
          }
          this->total_size = this->total_size + 0x18;
          uVar6 = this->compression_buffer_idx;
          if ((uVar6 & 0x1f) != 0) {
            uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar6 & 0x1f);
            uVar6 = (uVar6 - uVar5) + 0x20;
          }
          this->total_size = this->total_size + (bVar8 * uVar6 >> 3);
          if ((bVar4 && uVar1 != 0) && bVar8 < bVar9) {
            return true;
          }
        }
      }
      if (this->can_do_for == true) {
        uVar1 = this->min_max_diff;
        uVar6 = 0x3f;
        if (uVar1 != 0) {
          for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        lVar10 = 0x40;
        if (uVar1 >> 0x38 == 0) {
          lVar10 = (uVar6 ^ 0xffffffffffffffc0) + 0x41;
        }
        if (this->compression_buffer_idx != 0) {
          puVar2 = this->compression_buffer;
          uVar5 = this->minimum;
          uVar6 = 0;
          do {
            puVar2[uVar6] = puVar2[uVar6] - uVar5;
            uVar6 = uVar6 + 1;
          } while (uVar6 < this->compression_buffer_idx);
        }
        uVar6 = this->compression_buffer_idx;
        if ((uVar6 & 0x1f) != 0) {
          uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar6 & 0x1f);
          uVar6 = (uVar6 - uVar5) + 0x20;
        }
        if (uVar1 == 0) {
          lVar10 = 0;
        }
        this->total_size = this->total_size + (lVar10 * uVar6 >> 3) + 0x10;
      }
      else {
        bVar7 = false;
      }
    }
    else {
      this->total_size = this->total_size + 0xc;
    }
  }
  return bVar7;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}